

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bup.cpp
# Opt level: O3

int processBup(istream *in,path *output)

{
  uint32_t uVar1;
  long lVar2;
  uint uVar3;
  char cVar4;
  uint uVar5;
  Size *pSVar6;
  Point PVar7;
  undefined8 *puVar8;
  pointer pBVar9;
  long *plVar10;
  bool bVar11;
  ulong *puVar12;
  Size SVar13;
  long *plVar14;
  ulong uVar15;
  pointer pBVar16;
  char cVar17;
  undefined8 uVar18;
  uint __len;
  ulong uVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  uint32_t *puVar21;
  pointer pBVar22;
  undefined1 auVar23 [16];
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string outTemplate;
  vector<MaskRect,_std::allocator<MaskRect>_> maskData;
  string __str_4;
  Image base;
  BupHeader header;
  path outputDir;
  string_type local_2a0;
  long *local_280;
  string local_278;
  undefined1 local_258 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248 [2];
  long *local_228;
  long local_220;
  long local_218 [2];
  undefined1 local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1f8;
  istream *local_1e0;
  vector<MaskRect,_std::allocator<MaskRect>_> local_1d8;
  pointer local_1c0;
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8 [2];
  Image local_198;
  Image local_178;
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  long *local_138 [2];
  long local_128 [2];
  undefined1 local_118 [32];
  _List local_f8;
  vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_> vStack_f0;
  Size local_d8;
  pointer local_d0;
  pointer pCStack_c8;
  pointer local_c0;
  long *local_b8 [2];
  long local_a8 [2];
  vector<MaskRect,_std::allocator<MaskRect>_> local_98;
  path local_80;
  path local_58;
  
  local_1e0 = in;
  std::filesystem::__cxx11::path::parent_path();
  auVar23 = std::filesystem::__cxx11::path::_M_find_extension();
  if (auVar23._8_8_ == 0 || auVar23._0_8_ == 0) {
    std::filesystem::__cxx11::path::path((path *)local_118);
  }
  else {
    std::__cxx11::string::substr((ulong)local_208,auVar23._0_8_);
    std::filesystem::__cxx11::path::path((path *)local_118,(string_type *)local_208,auto_format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._0_8_ != &aStack_1f8) {
      operator_delete((void *)local_208._0_8_,aStack_1f8._M_allocated_capacity + 1);
    }
  }
  lVar2 = CONCAT26(local_118._6_2_,CONCAT51(local_118._1_5_,local_118[0]));
  local_228 = local_218;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_228,lVar2,CONCAT62(local_118._10_6_,local_118._8_2_) + lVar2);
  std::filesystem::__cxx11::path::~path((path *)local_118);
  if (SAVE_BUP_AS_PARTS == true) {
    BupOutputter::makeParts();
  }
  else {
    BupOutputter::makeComposited();
  }
  vStack_f0.super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_f0.super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  vStack_f0.super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118._16_8_ = (uint32_t *)0x0;
  local_118._24_8_ = (uint32_t *)0x0;
  operator>>(local_1e0,(BupHeader *)local_118);
  local_198.size = (Size)((ulong)(ushort)local_118._6_2_ + ((ulong)(ushort)local_118._8_2_ << 0x20))
  ;
  local_208._0_8_ = (ulong)(uint)local_208._4_4_ << 0x20;
  std::vector<Color,_std::allocator<Color>_>::vector
            (&local_198.colorData,
             (long)(int)((uint)(ushort)local_118._6_2_ * (uint)(ushort)local_118._8_2_),
             (value_type *)local_208,(allocator_type *)local_258);
  local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.size.width = 0;
  local_178.size.height = 0;
  local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1d8.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1c0 = (pointer)local_118._24_8_;
  if (local_118._16_8_ != local_118._24_8_) {
    puVar21 = (uint32_t *)local_118._16_8_;
    do {
      uVar18 = local_118._16_8_;
      local_258._0_8_ = local_248;
      uVar1 = *puVar21;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_258,local_228,local_220 + (long)local_228);
      std::__cxx11::string::append((char *)local_258);
      uVar19 = (long)puVar21 - uVar18 >> 2;
      cVar17 = '\x01';
      paVar20 = &local_2a0.field_2;
      if (9 < uVar19) {
        uVar15 = uVar19;
        cVar4 = '\x04';
        do {
          cVar17 = cVar4;
          if (uVar15 < 100) {
            cVar17 = cVar17 + -2;
            goto LAB_00111833;
          }
          if (uVar15 < 1000) {
            cVar17 = cVar17 + -1;
            goto LAB_00111833;
          }
          if (uVar15 < 10000) goto LAB_00111833;
          bVar11 = 99999 < uVar15;
          uVar15 = uVar15 / 10000;
          cVar4 = cVar17 + '\x04';
        } while (bVar11);
        cVar17 = cVar17 + '\x01';
      }
LAB_00111833:
      local_2a0._M_dataplus._M_p = (pointer)paVar20;
      std::__cxx11::string::_M_construct((ulong)&local_2a0,cVar17);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_2a0._M_dataplus._M_p,(uint)local_2a0._M_string_length,uVar19);
      uVar18 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._0_8_ != local_248) {
        uVar18 = local_248[0]._M_allocated_capacity;
      }
      if ((ulong)uVar18 < local_2a0._M_string_length + local_258._8_8_) {
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != paVar20) {
          uVar18 = local_2a0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_2a0._M_string_length + local_258._8_8_) goto LAB_0011189c;
        pSVar6 = (Size *)std::__cxx11::string::replace
                                   ((ulong)&local_2a0,0,(char *)0x0,local_258._0_8_);
      }
      else {
LAB_0011189c:
        pSVar6 = (Size *)std::__cxx11::string::_M_append
                                   (local_258,(ulong)local_2a0._M_dataplus._M_p);
      }
      SVar13 = (Size)(pSVar6 + 2);
      if (*pSVar6 == SVar13) {
        aStack_1f8._M_allocated_capacity = *(undefined8 *)SVar13;
        aStack_1f8._8_8_ = pSVar6[3];
        local_208._0_8_ = &aStack_1f8;
      }
      else {
        aStack_1f8._M_allocated_capacity = *(undefined8 *)SVar13;
        local_208._0_8_ = *pSVar6;
      }
      local_208._8_8_ = pSVar6[1];
      *pSVar6 = SVar13;
      pSVar6[1].width = 0;
      pSVar6[1].height = 0;
      *(char *)SVar13 = '\0';
      PVar7 = processChunk(&local_178,&local_1d8,uVar1,local_1e0,(string *)local_208,local_118[0]);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._0_8_ != &aStack_1f8) {
        operator_delete((void *)local_208._0_8_,aStack_1f8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != paVar20) {
        operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._0_8_ != local_248) {
        operator_delete((void *)local_258._0_8_,local_248[0]._M_allocated_capacity + 1);
      }
      std::vector<MaskRect,_std::allocator<MaskRect>_>::vector(&local_98,&local_1d8);
      Image::drawOnto(&local_178,&local_198,PVar7,&local_98);
      if (local_98.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_98.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      puVar21 = puVar21 + 1;
    } while ((pointer)puVar21 != local_1c0);
  }
  if (SHOULD_WRITE_DEBUG_IMAGES != false) {
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,local_228,local_220 + (long)local_228);
    std::__cxx11::string::append((char *)&local_2a0);
    std::filesystem::__cxx11::path::path((path *)local_258,&local_2a0,auto_format);
    std::filesystem::__cxx11::operator/
              ((path *)local_208,&debugImagePath_abi_cxx11_,(path *)local_258);
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"");
    Image::writePNG(&local_198,(path *)local_208,&local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path((path *)local_208);
    std::filesystem::__cxx11::path::~path((path *)local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
  }
  plVar10 = local_280;
  std::filesystem::__cxx11::path::path(&local_80,&local_58);
  local_d8 = local_198.size;
  local_d0 = local_198.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
             super__Vector_impl_data._M_start;
  pCStack_c8 = local_198.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
               super__Vector_impl_data._M_finish;
  local_c0 = local_198.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_198.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b8,local_228,local_220 + (long)local_228);
  (**(code **)(*plVar10 + 0x10))(plVar10,&local_80,&local_d8,local_b8);
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0],local_a8[0] + 1);
  }
  if (local_d0 != (pointer)0x0) {
    operator_delete(local_d0,(long)local_c0 - (long)local_d0);
  }
  std::filesystem::__cxx11::path::~path(&local_80);
  local_208._8_8_ = (void *)0x0;
  aStack_1f8._M_allocated_capacity = 0;
  aStack_1f8._8_8_ = 0;
  local_1c0 = vStack_f0.super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (vStack_f0.super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>._M_impl.
      super__Vector_impl_data._M_start !=
      vStack_f0.super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pBVar22 = vStack_f0.super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      local_208._0_4_ = local_198.size.width;
      local_208._4_4_ = local_198.size.height;
      std::vector<Color,_std::allocator<Color>_>::operator=
                ((vector<Color,_std::allocator<Color>_> *)(local_208 + 8),&local_198.colorData);
      plVar10 = local_280;
      uVar1 = (pBVar22->face).offset;
      if (uVar1 == 0) {
        local_248[0]._M_allocated_capacity = 0;
        local_248[0]._8_8_ = 0;
        local_258._0_4_ = 0;
        local_258._4_4_ = 0;
        local_258._8_4_ = 0;
        local_258._12_4_ = 0;
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"");
        local_278._M_dataplus._M_p = (pointer)0x0;
        local_278._M_string_length = 0;
        local_278.field_2._M_allocated_capacity = 0;
        (**(code **)(*plVar10 + 0x18))(plVar10,local_258,0,&local_2a0,&local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_278._M_dataplus._M_p,
                          local_278.field_2._M_allocated_capacity - (long)local_278._M_dataplus._M_p
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
        }
        if ((Size)local_258._8_8_ != (Size)0x0) {
          operator_delete((void *)local_258._8_8_,local_248[0]._8_8_ - local_258._8_8_);
        }
      }
      else {
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,local_228,local_220 + (long)local_228);
        std::__cxx11::string::append((char *)&local_278);
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_278,(ulong)(pBVar22->name)._M_dataplus._M_p);
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        puVar12 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_2a0.field_2._M_allocated_capacity = *puVar12;
          local_2a0.field_2._8_8_ = puVar8[3];
        }
        else {
          local_2a0.field_2._M_allocated_capacity = *puVar12;
          local_2a0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_2a0._M_string_length = puVar8[1];
        *puVar8 = puVar12;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        pSVar6 = (Size *)std::__cxx11::string::append((char *)&local_2a0);
        SVar13 = (Size)(pSVar6 + 2);
        if (*pSVar6 == SVar13) {
          local_248[0]._0_8_ = *(undefined8 *)SVar13;
          local_248[0]._8_8_ = pSVar6[3];
          local_258._0_8_ = local_248;
        }
        else {
          local_248[0]._0_8_ = *(undefined8 *)SVar13;
          local_258._0_8_ = *pSVar6;
        }
        local_258._8_8_ = pSVar6[1];
        *pSVar6 = SVar13;
        pSVar6[1].width = 0;
        pSVar6[1].height = 0;
        *(undefined1 *)&pSVar6[2].width = 0;
        PVar7 = processChunk(&local_178,&local_1d8,uVar1,local_1e0,(string *)local_258,local_118[0])
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._0_8_ != local_248) {
          operator_delete((void *)local_258._0_8_,local_248[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        (**(code **)(*local_280 + 0x18))(local_280,&local_178,PVar7,pBVar22,&local_1d8);
      }
      paVar20 = &local_278.field_2;
      pBVar16 = (pBVar22->mouths).super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl.
                super__Vector_impl_data._M_start;
      pBVar9 = (pBVar22->mouths).super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pBVar9 == pBVar16) {
LAB_00112231:
        (**(code **)(*local_280 + 0x28))();
      }
      else {
        uVar19 = 0;
        bVar11 = false;
        do {
          while (pBVar16[uVar19].offset == 0) {
            uVar19 = uVar19 + 1;
            if ((ulong)((long)pBVar9 - (long)pBVar16 >> 2) <= uVar19) {
              if (bVar11) goto LAB_0011223c;
              goto LAB_00112231;
            }
          }
          local_258._0_8_ = local_208._0_8_;
          std::vector<Color,_std::allocator<Color>_>::vector
                    ((vector<Color,_std::allocator<Color>_> *)(local_258 + 8),
                     (vector<Color,_std::allocator<Color>_> *)(local_208 + 8));
          uVar1 = pBVar16[uVar19].offset;
          local_138[0] = local_128;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_138,local_228,local_220 + (long)local_228);
          std::__cxx11::string::append((char *)local_138);
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)local_138,(ulong)(pBVar22->name)._M_dataplus._M_p);
          local_158 = &local_148;
          plVar14 = plVar10 + 2;
          if ((long *)*plVar10 == plVar14) {
            local_148 = *plVar14;
            lStack_140 = plVar10[3];
          }
          else {
            local_148 = *plVar14;
            local_158 = (long *)*plVar10;
          }
          local_150 = plVar10[1];
          *plVar10 = (long)plVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_158);
          puVar12 = (ulong *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_278.field_2._M_allocated_capacity = *puVar12;
            local_278.field_2._8_8_ = plVar10[3];
            local_278._M_dataplus._M_p = (pointer)paVar20;
          }
          else {
            local_278.field_2._M_allocated_capacity = *puVar12;
            local_278._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_278._M_string_length = plVar10[1];
          *plVar10 = (long)puVar12;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          __len = 1;
          if (9 < uVar19) {
            uVar3 = 4;
            uVar15 = uVar19;
            do {
              __len = uVar3;
              uVar5 = (uint)uVar15;
              if (uVar5 < 100) {
                __len = __len - 2;
                goto LAB_00112007;
              }
              if (uVar5 < 1000) {
                __len = __len - 1;
                goto LAB_00112007;
              }
              if (uVar5 < 10000) goto LAB_00112007;
              uVar15 = (uVar15 & 0xffffffff) / 10000;
              uVar3 = __len + 4;
            } while (99999 < uVar5);
            __len = __len + 1;
          }
LAB_00112007:
          local_1b8 = local_1a8;
          std::__cxx11::string::_M_construct((ulong)&local_1b8,(char)__len);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1b8,__len,(uint)uVar19);
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != paVar20) {
            uVar18 = local_278.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < local_1b0 + local_278._M_string_length) {
            uVar15 = 0xf;
            if (local_1b8 != local_1a8) {
              uVar15 = local_1a8[0];
            }
            if (uVar15 < local_1b0 + local_278._M_string_length) goto LAB_00112098;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_1b8,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
          }
          else {
LAB_00112098:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_1b8);
          }
          local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
          puVar12 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_2a0.field_2._M_allocated_capacity = *puVar12;
            local_2a0.field_2._8_8_ = puVar8[3];
          }
          else {
            local_2a0.field_2._M_allocated_capacity = *puVar12;
            local_2a0._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_2a0._M_string_length = puVar8[1];
          *puVar8 = puVar12;
          puVar8[1] = 0;
          *(undefined1 *)puVar12 = 0;
          PVar7 = processChunk(&local_178,&local_1d8,uVar1,local_1e0,&local_2a0,local_118[0]);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
          }
          if (local_1b8 != local_1a8) {
            operator_delete(local_1b8,local_1a8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != paVar20) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if (local_158 != &local_148) {
            operator_delete(local_158,local_148 + 1);
          }
          if (local_138[0] != local_128) {
            operator_delete(local_138[0],local_128[0] + 1);
          }
          (**(code **)(*local_280 + 0x20))
                    (local_280,&local_178,PVar7,uVar19 & 0xffffffff,&local_1d8);
          (**(code **)(*local_280 + 0x28))();
          if ((Size)local_258._8_8_ != (Size)0x0) {
            operator_delete((void *)local_258._8_8_,local_248[0]._8_8_ - local_258._8_8_);
          }
          pBVar16 = (pBVar22->mouths).super__Vector_base<BupChunk,_std::allocator<BupChunk>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pBVar9 = (pBVar22->mouths).super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl
                   .super__Vector_impl_data._M_finish;
          uVar19 = uVar19 + 1;
          bVar11 = true;
        } while (uVar19 < (ulong)((long)pBVar9 - (long)pBVar16 >> 2));
      }
LAB_0011223c:
      pBVar22 = pBVar22 + 1;
    } while (pBVar22 != local_1c0);
    if ((void *)local_208._8_8_ != (void *)0x0) {
      operator_delete((void *)local_208._8_8_,aStack_1f8._8_8_ - local_208._8_8_);
    }
  }
  if (local_1d8.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_198.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>::~vector(&vStack_f0);
  if ((uint32_t *)local_118._16_8_ != (uint32_t *)0x0) {
    operator_delete((void *)local_118._16_8_,
                    (long)local_f8._M_impl._M_t.
                          super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                          .
                          super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                          ._M_head_impl - local_118._16_8_);
  }
  if (local_280 != (long *)0x0) {
    (**(code **)(*local_280 + 8))();
  }
  if (local_228 != local_218) {
    operator_delete(local_228,local_218[0] + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_58);
  return 0;
}

Assistant:

int processBup(std::istream &in, const fs::path &output) {
	fs::path outputDir = output.parent_path();
	std::string outTemplate = output.stem().string();

	std::unique_ptr<BupOutputter> out = SAVE_BUP_AS_PARTS ? BupOutputter::makeParts() : BupOutputter::makeComposited();

	BupHeader header;
	in >> header;

	Image base({header.width, header.height}), currentChunk({0, 0});
	std::vector<MaskRect> maskData;

	for (const auto& chunk : header.chunks) {
		size_t i = &chunk - &header.chunks[0];

		Point pos = processChunk(currentChunk, maskData, chunk.offset, in, outTemplate + "_BaseChunk" + std::to_string(i), header.isSwitch);

		currentChunk.drawOnto(base, pos, maskData);
	}
	if (SHOULD_WRITE_DEBUG_IMAGES) {
		base.writePNG(debugImagePath/(outTemplate + "_Base.png"));
	}

	out->setBase(outputDir, std::move(base), outTemplate);

	Image withEyes({0, 0});

	for (const auto& expChunk : header.expChunks) {
		withEyes = base;

		if (expChunk.face.offset) {
			Point facePos = processChunk(currentChunk, maskData, expChunk.face.offset, in, outTemplate + "_" + expChunk.name + "_Face", header.isSwitch);
			out->newFace(currentChunk, facePos, expChunk.name, maskData);
		} else {
			out->newFace(Image(), {0, 0}, "", {});
		}

		bool atLeastOneMouth = false;
		for (int i = 0; i < expChunk.mouths.size(); i++) {
			const auto& mouth = expChunk.mouths[i];

			if (!mouth.offset) { continue; }
			atLeastOneMouth = true;

			Image withMouth = withEyes;

			Point mouthPos = processChunk(currentChunk, maskData, mouth.offset, in, outTemplate + "_" + expChunk.name + "_Mouth" + std::to_string(i), header.isSwitch);
			out->newMouth(currentChunk, mouthPos, i, maskData);
			out->write();
		}
		if (!atLeastOneMouth) {
			out->write();
		}
	}

	return 0;
}